

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O2

int zlib_huflookup(unsigned_long *bitsp,int *nbitsp,zlib_table *tab)

{
  byte bVar1;
  short sVar2;
  zlib_tableentry *pzVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  unsigned_long uVar7;
  
  uVar7 = *bitsp;
  iVar5 = *nbitsp;
  while( true ) {
    pzVar3 = tab->table;
    uVar4 = (long)tab->mask & uVar7;
    bVar1 = pzVar3[uVar4].nbits;
    iVar6 = iVar5 - (uint)bVar1;
    if (iVar5 < (int)(uint)bVar1) {
      return -1;
    }
    uVar7 = uVar7 >> (bVar1 & 0x3f);
    sVar2 = pzVar3[uVar4].code;
    if (sVar2 != -1) break;
    tab = pzVar3[uVar4].nexttable;
    iVar5 = iVar6;
    if (tab == (zlib_table *)0x0) {
      return -2;
    }
  }
  *bitsp = uVar7;
  *nbitsp = iVar6;
  return (int)sVar2;
}

Assistant:

static int zlib_huflookup(unsigned long *bitsp, int *nbitsp,
                   struct zlib_table *tab)
{
    unsigned long bits = *bitsp;
    int nbits = *nbitsp;
    while (1) {
        struct zlib_tableentry *ent;
        ent = &tab->table[bits & tab->mask];
        if (ent->nbits > nbits)
            return -1;                 /* not enough data */
        bits >>= ent->nbits;
        nbits -= ent->nbits;
        if (ent->code == -1)
            tab = ent->nexttable;
        else {
            *bitsp = bits;
            *nbitsp = nbits;
            return ent->code;
        }

        if (!tab) {
            /*
             * There was a missing entry in the table, presumably
             * due to an invalid Huffman table description, and the
             * subsequent data has attempted to use the missing
             * entry. Return a decoding failure.
             */
            return -2;
        }
    }
}